

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *this)

{
  JavascriptWeakSet *this_00;
  JavascriptWeakSet *data;
  RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *this_local;
  
  this_00 = VarTo<Js::JavascriptWeakSet>(this->instance);
  JavascriptWeakSet::
  Map<Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::GetChildren()::__0>
            (this_00,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptWeakSet>::GetChildren()
    {
        JavascriptWeakSet* data = VarTo<JavascriptWeakSet>(instance);
        data->Map([&](Var value)
        {
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptWeakSet>(value));
        });
    }